

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_group_ops
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  long *plVar8;
  long lVar9;
  int *piVar10;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  byte bVar27;
  undefined1 (*pauVar28) [16];
  int i;
  pointer ppLVar29;
  Layer *pLVar30;
  long lVar31;
  ulong uVar32;
  void *pvVar33;
  int iVar34;
  pointer ppLVar35;
  void *in_R8;
  Allocator *pAVar36;
  long lVar37;
  bool bVar38;
  ushort uVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  ParamDict pd;
  Mat local_2b8;
  undefined1 auStack_26c [8];
  int local_264;
  uint local_260;
  int local_25c;
  undefined1 local_258 [40];
  undefined1 local_230 [16];
  int local_220 [2];
  size_t local_218;
  Allocator *local_210;
  int iStack_208;
  undefined4 uStack_204;
  size_t sStack_200;
  uint uStack_1f8;
  Allocator *local_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  size_t local_1d0;
  void *local_1c8;
  int *piStack_1c0;
  size_t sStack_1b8;
  int iStack_1b0;
  Allocator *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  int local_190;
  size_t local_188;
  void *local_180;
  int *piStack_178;
  long lStack_170;
  undefined4 uStack_168;
  long *local_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined8 local_140;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  long lStack_128;
  undefined4 uStack_120;
  long *local_118;
  undefined8 local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  int local_b0;
  size_t local_a8;
  undefined1 (*local_a0) [16];
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  undefined1 (*local_88) [16];
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_80;
  size_t local_78;
  Allocator *local_70;
  size_t local_68;
  ParamDict local_60;
  size_t local_50;
  undefined1 *local_48;
  size_t local_40;
  Option *local_38;
  
  ppLVar35 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar34 = *(int *)(&this->field_0xd8 + (long)p_Var6) * *(int *)(&this->field_0xd4 + (long)p_Var6);
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var6);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var6);
  uVar32 = (long)*(int *)(&this->field_0x104 + (long)p_Var6) / (long)iVar3;
  uVar32 = (long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar32 & 0xffffffff) / (long)iVar34;
  ppLVar29 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_38 = opt;
  if (0 < (int)((ulong)((long)ppLVar29 - (long)ppLVar35) >> 3)) {
    lVar37 = 0;
    do {
      if (ppLVar35[lVar37] != (Layer *)0x0) {
        (*ppLVar35[lVar37]->_vptr_Layer[1])();
      }
      lVar37 = lVar37 + 1;
      ppLVar35 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar29 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar37 < (int)((ulong)((long)ppLVar29 - (long)ppLVar35) >> 3));
  }
  local_80 = &this->group_ops;
  if (ppLVar29 != ppLVar35) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar35;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_80,(long)iVar4);
  pp_Var7 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  if (0 < *(int *)(&this->field_0x108 + (long)pp_Var7[-3])) {
    local_48 = &this->field_0x118;
    local_25c = iVar34 * i *
                (((int)((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar32 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_40 = (size_t)local_25c;
    local_50 = (size_t)i;
    local_88 = (undefined1 (*) [16])&local_1c8;
    local_90 = (undefined1 (*) [16])&local_1a0;
    local_98 = (undefined1 (*) [16])&local_180;
    local_a0 = (undefined1 (*) [16])&local_158;
    lVar37 = 0;
    do {
      p_Var6 = pp_Var7[-3];
      local_258._16_8_ = *(undefined8 *)(&this->field_0x178 + (long)p_Var6);
      local_258._0_8_ =
           lVar37 * local_40 * local_258._16_8_ + *(long *)(&this->field_0x168 + (long)p_Var6);
      local_258._24_4_ = *(undefined4 *)(&this->field_0x180 + (long)p_Var6);
      local_258._32_8_ = *(undefined8 *)(&this->field_0x188 + (long)p_Var6);
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_230._4_4_ = (int)local_40;
      local_230._0_4_ = 1;
      local_230._8_8_ = 0x100000001;
      local_220[0] = 1;
      local_218 = local_40;
      Mat::clone((Mat *)local_e8,(__fn *)local_258,(void *)0x0,1,in_R8);
      piVar10 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            if ((void *)local_258._0_8_ != (void *)0x0) {
              free((void *)local_258._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      local_218 = 0;
      local_258._0_8_ = (void *)0x0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_8_ = 0;
      local_258._24_4_ = 0;
      local_230 = (undefined1  [16])0x0;
      local_220[0] = 0;
      p_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
      bVar38 = *(int *)(&this->field_0x100 + (long)p_Var6) == 0;
      if (bVar38) {
        pAVar36 = (Allocator *)0x0;
        local_68 = 0;
        local_260 = 0;
        local_70 = (Allocator *)0x0;
        local_264 = 0;
        local_78 = 0;
      }
      else {
        local_68 = *(size_t *)(&this->field_0x1c0 + (long)p_Var6);
        pAVar36 = (Allocator *)
                  (lVar37 * local_50 * local_68 + *(long *)(&this->field_0x1b0 + (long)p_Var6));
        local_260 = *(uint *)(&this->field_0x1c8 + (long)p_Var6);
        local_70 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var6);
        local_78 = local_50;
        local_264 = i;
      }
      bVar38 = !bVar38;
      pLVar30 = create_layer(6);
      ParamDict::ParamDict(&local_60);
      ParamDict::set(&local_60,0,i);
      ParamDict::set(&local_60,1,
                     *(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,0xb,
                     *(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,2,
                     *(int *)(&this->field_0xdc +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,0xc,
                     *(int *)(&this->field_0xe0 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,3,
                     *(int *)(&this->field_0xe4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,0xd,
                     *(int *)(&this->field_0xe8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,4,0);
      ParamDict::set(&local_60,0xe,0);
      ParamDict::set(&local_60,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,6,local_25c);
      ParamDict::set(&local_60,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_60,10,
                     (Mat *)(local_48 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      (*pLVar30->_vptr_Layer[2])(pLVar30,&local_60);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) == 0)
      {
        lVar31 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar31) = 0;
          *(undefined1 (*) [16])((long)&local_2b8.allocator + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.w + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.cstep + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(auStack_26c + lVar31) = (undefined1  [16])0x0;
          lVar31 = lVar31 + 0x48;
        } while (lVar31 != 0x160);
        piVar10 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        piVar10 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8._0_8_;
        local_258._8_4_ = local_e8._8_4_;
        local_258._12_4_ = local_e8._12_4_;
        local_258._16_8_ = local_e8._16_8_;
        local_258._24_4_ = local_e8._24_4_;
        local_258._32_8_ = local_e8._32_8_;
        local_230 = local_c0;
        local_220[0] = local_b0;
        local_218 = local_a8;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) !=
            0) {
          local_2b8.cstep = 0;
          local_2b8.data = (Allocator *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
          local_2b8.elempack = 0;
          local_2b8.allocator = (Allocator *)local_2b8.data;
          local_2b8.dims = (int)local_2b8.refcount;
          local_2b8.w = local_2b8.elempack;
          local_2b8._48_8_ = local_2b8.elemsize;
          local_2b8.c = local_2b8.elempack;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_2b8.c * (int)local_2b8.cstep) {
            auVar42 = vpbroadcastq_avx512f();
            auVar43 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)(*(long *)(&this->field_0x1f8 +
                                                            (long)this->
                                                  _vptr_ConvolutionDepthWise_x86_avx512[-3]) +
                                                  lVar37 * 4)));
            uVar32 = 0;
            do {
              auVar44 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar44,auVar40);
              auVar44 = vporq_avx512f(auVar44,auVar41);
              uVar25 = vpcmpuq_avx512f(auVar44,auVar42,2);
              uVar26 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar27 = (byte)uVar26;
              uVar39 = CONCAT11(bVar27,(byte)uVar25);
              puVar1 = (uint *)((long)(_func_int ***)local_2b8.data + uVar32 * 4);
              bVar38 = (bool)((byte)uVar25 & 1);
              bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar39 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar39 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
              bVar18 = (bool)((byte)(uVar39 >> 7) & 1);
              bVar19 = (bool)(bVar27 >> 1 & 1);
              bVar20 = (bool)(bVar27 >> 2 & 1);
              bVar21 = (bool)(bVar27 >> 3 & 1);
              bVar22 = (bool)(bVar27 >> 4 & 1);
              bVar23 = (bool)(bVar27 >> 5 & 1);
              bVar24 = (bool)(bVar27 >> 6 & 1);
              *puVar1 = (uint)bVar38 * auVar43._0_4_ | (uint)!bVar38 * *puVar1;
              puVar1[1] = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * puVar1[1];
              puVar1[2] = (uint)bVar13 * auVar43._8_4_ | (uint)!bVar13 * puVar1[2];
              puVar1[3] = (uint)bVar14 * auVar43._12_4_ | (uint)!bVar14 * puVar1[3];
              puVar1[4] = (uint)bVar15 * auVar43._16_4_ | (uint)!bVar15 * puVar1[4];
              puVar1[5] = (uint)bVar16 * auVar43._20_4_ | (uint)!bVar16 * puVar1[5];
              puVar1[6] = (uint)bVar17 * auVar43._24_4_ | (uint)!bVar17 * puVar1[6];
              puVar1[7] = (uint)bVar18 * auVar43._28_4_ | (uint)!bVar18 * puVar1[7];
              puVar1[8] = (uint)(bVar27 & 1) * auVar43._32_4_ |
                          (uint)!(bool)(bVar27 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar19 * auVar43._36_4_ | (uint)!bVar19 * puVar1[9];
              puVar1[10] = (uint)bVar20 * auVar43._40_4_ | (uint)!bVar20 * puVar1[10];
              puVar1[0xb] = (uint)bVar21 * auVar43._44_4_ | (uint)!bVar21 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar22 * auVar43._48_4_ | (uint)!bVar22 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar23 * auVar43._52_4_ | (uint)!bVar23 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar24 * auVar43._56_4_ | (uint)!bVar24 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar27 >> 7) * auVar43._60_4_ |
                            (uint)!(bool)(bVar27 >> 7) * puVar1[0xf];
              uVar32 = uVar32 + 0x10;
            } while ((local_2b8.c * (int)local_2b8.cstep + 0xfU & 0xfffffff0) != uVar32);
          }
          piVar10 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + 1;
            UNLOCK();
          }
          piVar10 = (int *)CONCAT44(uStack_204,iStack_208);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_1f0 == (Allocator *)0x0) {
                if (local_210 != (Allocator *)0x0) {
                  free(local_210);
                }
              }
              else {
                (*local_1f0->_vptr_Allocator[3])();
              }
            }
          }
          local_210 = (Allocator *)local_2b8.data;
          iStack_208 = (int)local_2b8.refcount;
          uStack_204 = local_2b8.refcount._4_4_;
          sStack_200 = local_2b8.elemsize;
          uStack_1f8 = local_2b8.elempack;
          local_1f0 = local_2b8.allocator;
          local_1e8._4_4_ = local_2b8.w;
          local_1e8._0_4_ = local_2b8.dims;
          local_1e8._8_4_ = local_2b8.h;
          local_1e8._12_4_ = local_2b8.d;
          local_1d8 = local_2b8.c;
          local_1d0 = local_2b8.cstep;
          p_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          sVar11 = *(size_t *)(&this->field_0x250 + (long)p_Var6);
          pvVar33 = (void *)(sVar11 * lVar37 + *(long *)(&this->field_0x240 + (long)p_Var6));
          iVar2 = *(int *)(&this->field_0x258 + (long)p_Var6);
          pAVar36 = *(Allocator **)(&this->field_0x260 + (long)p_Var6);
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (void *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          pauVar28 = local_88;
          *(undefined1 (*) [16])(*local_88 + 0xc) = (undefined1  [16])0x0;
          *pauVar28 = (undefined1  [16])0x0;
          pauVar28 = local_90;
          *local_90 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar28[1] = 0;
          piStack_1c0 = (int *)0x0;
          local_1a0 = 0x100000001;
          uStack_198 = 0x100000001;
          local_190 = 1;
          local_188 = 1;
          piVar10 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          local_1c8 = pvVar33;
          sStack_1b8 = sVar11;
          iStack_1b0 = iVar2;
          local_1a8 = pAVar36;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2b8.data != (Allocator *)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        p_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var6)) {
          lVar31 = *(long *)(&this->field_0x298 + (long)p_Var6);
          lVar9 = *(long *)(&this->field_0x288 + (long)p_Var6);
          uVar5 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var6);
          plVar8 = *(long **)(&this->field_0x2a8 + (long)p_Var6);
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (long *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (**(code **)(*local_160 + 0x18))();
              }
            }
          }
          pauVar28 = local_98;
          *(undefined1 (*) [16])(*local_98 + 0xc) = (undefined1  [16])0x0;
          *pauVar28 = (undefined1  [16])0x0;
          pauVar28 = local_a0;
          *local_a0 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar28[1] = 0;
          piStack_178 = (int *)0x0;
          local_158 = 1;
          uStack_154 = 1;
          uStack_150 = 1;
          uStack_14c = 1;
          local_148 = 1;
          local_140 = 1;
          local_180 = (void *)(lVar31 * lVar37 + lVar9);
          lStack_170 = lVar31;
          uStack_168 = uVar5;
          local_160 = plVar8;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar30->_vptr_Layer[3])(pLVar30,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar31 = 0xd8;
        do {
          piVar10 = *(int **)(local_258 + lVar31 + 8);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (*(long **)(local_230 + lVar31 + -8) == (long *)0x0) {
                if (*(void **)(local_258 + lVar31) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar31));
                }
              }
              else {
                (**(code **)(**(long **)(local_230 + lVar31 + -8) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar31) = 0;
          *(undefined1 (*) [16])(local_258 + lVar31 + 0xc) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_258 + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_230 + lVar31) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_220 + lVar31) = 0;
          lVar31 = lVar31 + -0x48;
        } while (lVar31 != -0x48);
      }
      else {
        lVar31 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar31) = 0;
          *(undefined1 (*) [16])((long)&local_2b8.allocator + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.w + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.cstep + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(auStack_26c + lVar31) = (undefined1  [16])0x0;
          lVar31 = lVar31 + 0x48;
        } while (lVar31 != 0x1a8);
        piVar10 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        piVar10 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8._0_8_;
        local_258._8_4_ = local_e8._8_4_;
        local_258._12_4_ = local_e8._12_4_;
        local_258._16_8_ = local_e8._16_8_;
        local_258._24_4_ = local_e8._24_4_;
        local_258._32_8_ = local_e8._32_8_;
        local_230 = local_c0;
        local_220[0] = local_b0;
        local_218 = local_a8;
        piVar10 = (int *)CONCAT44(uStack_204,iStack_208);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_1f0 == (Allocator *)0x0) {
              if (local_210 != (Allocator *)0x0) {
                free(local_210);
              }
            }
            else {
              (*local_1f0->_vptr_Allocator[3])();
            }
          }
        }
        iStack_208 = 0;
        uStack_204 = 0;
        sStack_200 = local_68;
        uStack_1f8 = local_260;
        local_1f0 = local_70;
        local_1d8 = CONCAT31(0,bVar38);
        local_1e8._4_4_ = local_264;
        local_1e8._0_4_ = local_1d8;
        local_1e8[8] = bVar38;
        local_1e8._9_3_ = 0;
        local_1e8[0xc] = bVar38;
        local_1e8._13_3_ = 0;
        local_1d0 = local_78;
        local_210 = pAVar36;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) !=
            0) {
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = 0;
          local_2b8.elempack = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
          local_2b8.allocator = (Allocator *)0x0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_2b8.c * (int)local_2b8.cstep) {
            auVar42 = vpbroadcastq_avx512f();
            auVar43 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)(*(long *)(&this->field_0x1f8 +
                                                            (long)this->
                                                  _vptr_ConvolutionDepthWise_x86_avx512[-3]) +
                                                  lVar37 * 4)));
            uVar32 = 0;
            do {
              auVar44 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar44,auVar40);
              auVar44 = vporq_avx512f(auVar44,auVar41);
              uVar25 = vpcmpuq_avx512f(auVar44,auVar42,2);
              uVar26 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar27 = (byte)uVar26;
              uVar39 = CONCAT11(bVar27,(byte)uVar25);
              puVar1 = (uint *)((long)local_2b8.data + uVar32 * 4);
              bVar38 = (bool)((byte)uVar25 & 1);
              bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar39 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar39 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
              bVar18 = (bool)((byte)(uVar39 >> 7) & 1);
              bVar19 = (bool)(bVar27 >> 1 & 1);
              bVar20 = (bool)(bVar27 >> 2 & 1);
              bVar21 = (bool)(bVar27 >> 3 & 1);
              bVar22 = (bool)(bVar27 >> 4 & 1);
              bVar23 = (bool)(bVar27 >> 5 & 1);
              bVar24 = (bool)(bVar27 >> 6 & 1);
              *puVar1 = (uint)bVar38 * auVar43._0_4_ | (uint)!bVar38 * *puVar1;
              puVar1[1] = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * puVar1[1];
              puVar1[2] = (uint)bVar13 * auVar43._8_4_ | (uint)!bVar13 * puVar1[2];
              puVar1[3] = (uint)bVar14 * auVar43._12_4_ | (uint)!bVar14 * puVar1[3];
              puVar1[4] = (uint)bVar15 * auVar43._16_4_ | (uint)!bVar15 * puVar1[4];
              puVar1[5] = (uint)bVar16 * auVar43._20_4_ | (uint)!bVar16 * puVar1[5];
              puVar1[6] = (uint)bVar17 * auVar43._24_4_ | (uint)!bVar17 * puVar1[6];
              puVar1[7] = (uint)bVar18 * auVar43._28_4_ | (uint)!bVar18 * puVar1[7];
              puVar1[8] = (uint)(bVar27 & 1) * auVar43._32_4_ |
                          (uint)!(bool)(bVar27 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar19 * auVar43._36_4_ | (uint)!bVar19 * puVar1[9];
              puVar1[10] = (uint)bVar20 * auVar43._40_4_ | (uint)!bVar20 * puVar1[10];
              puVar1[0xb] = (uint)bVar21 * auVar43._44_4_ | (uint)!bVar21 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar22 * auVar43._48_4_ | (uint)!bVar22 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar23 * auVar43._52_4_ | (uint)!bVar23 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar24 * auVar43._56_4_ | (uint)!bVar24 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar27 >> 7) * auVar43._60_4_ |
                            (uint)!(bool)(bVar27 >> 7) * puVar1[0xf];
              uVar32 = uVar32 + 0x10;
            } while ((local_2b8.c * (int)local_2b8.cstep + 0xfU & 0xfffffff0) != uVar32);
          }
          piVar10 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + 1;
            UNLOCK();
          }
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (void *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          pauVar28 = local_88;
          *(undefined1 (*) [16])(*local_88 + 0xc) = (undefined1  [16])0x0;
          *pauVar28 = (undefined1  [16])0x0;
          pauVar28 = local_90;
          *local_90 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar28[1] = 0;
          piStack_1c0 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          local_1c8 = local_2b8.data;
          sStack_1b8 = local_2b8.elemsize;
          iStack_1b0 = local_2b8.elempack;
          local_1a8 = local_2b8.allocator;
          local_1a0._4_4_ = local_2b8.w;
          local_1a0._0_4_ = local_2b8.dims;
          uStack_198._0_4_ = local_2b8.h;
          uStack_198._4_4_ = local_2b8.d;
          local_190 = local_2b8.c;
          local_188 = local_2b8.cstep;
          p_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          lVar31 = *(long *)(&this->field_0x250 + (long)p_Var6);
          pvVar33 = (void *)(lVar31 * lVar37 + *(long *)(&this->field_0x240 + (long)p_Var6));
          uVar5 = *(undefined4 *)(&this->field_0x258 + (long)p_Var6);
          plVar8 = *(long **)(&this->field_0x260 + (long)p_Var6);
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (long *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (**(code **)(*local_160 + 0x18))();
              }
            }
          }
          pauVar28 = local_98;
          *(undefined1 (*) [16])(*local_98 + 0xc) = (undefined1  [16])0x0;
          *pauVar28 = (undefined1  [16])0x0;
          pauVar28 = local_a0;
          *local_a0 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar28[1] = 0;
          piStack_178 = (int *)0x0;
          local_158 = 1;
          uStack_154 = 1;
          uStack_150 = 1;
          uStack_14c = 1;
          local_148 = 1;
          local_140 = 1;
          piVar10 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          local_180 = pvVar33;
          lStack_170 = lVar31;
          uStack_168 = uVar5;
          local_160 = plVar8;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if (local_2b8.data != (void *)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        p_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var6)) {
          lVar31 = *(long *)(&this->field_0x298 + (long)p_Var6);
          lVar9 = *(long *)(&this->field_0x288 + (long)p_Var6);
          uVar5 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var6);
          plVar8 = *(long **)(&this->field_0x2a8 + (long)p_Var6);
          piVar10 = (int *)CONCAT44(uStack_12c,uStack_130);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_118 == (long *)0x0) {
                if (local_138 != (void *)0x0) {
                  free(local_138);
                }
              }
              else {
                (**(code **)(*local_118 + 0x18))();
              }
            }
          }
          uStack_130 = 0;
          uStack_12c = 0;
          uStack_108 = 1;
          local_110 = 0x100000001;
          uStack_104 = 1;
          local_100 = 1;
          local_f8 = 1;
          local_138 = (void *)(lVar31 * lVar37 + lVar9);
          lStack_128 = lVar31;
          uStack_120 = uVar5;
          local_118 = plVar8;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar30->_vptr_Layer[3])(pLVar30,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar31 = 0x120;
        do {
          piVar10 = *(int **)(local_258 + lVar31 + 8);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (*(long **)(local_230 + lVar31 + -8) == (long *)0x0) {
                if (*(void **)(local_258 + lVar31) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar31));
                }
              }
              else {
                (**(code **)(**(long **)(local_230 + lVar31 + -8) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar31) = 0;
          *(undefined1 (*) [16])(local_258 + lVar31 + 0xc) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_258 + lVar31) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_230 + lVar31) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_220 + lVar31) = 0;
          lVar31 = lVar31 + -0x48;
        } while (lVar31 != -0x48);
      }
      (*pLVar30->_vptr_Layer[4])(pLVar30,local_38);
      (local_80->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar37] = pLVar30;
      ParamDict::~ParamDict(&local_60);
      piVar10 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_e8._0_8_ != (void *)0x0) {
              free((void *)local_e8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_e8._32_8_)[3])();
          }
        }
      }
      local_a8 = 0;
      local_e8._0_8_ = (void *)0x0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      local_e8._16_8_ = 0;
      local_e8._24_4_ = 0;
      local_c0 = (undefined1  [16])0x0;
      local_b0 = 0;
      lVar37 = lVar37 + 1;
      pp_Var7 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    } while (lVar37 < *(int *)(&this->field_0x108 + (long)pp_Var7[-3]));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}